

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void show_grid_cb(Fl_Widget *param_1,void *param_2)

{
  char local_98 [4];
  int s;
  char buf [128];
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  buf._120_8_ = param_2;
  sprintf(local_98,"%d",(ulong)(uint)gridx);
  Fl_Input_::value((Fl_Input_ *)horizontal_input,local_98);
  sprintf(local_98,"%d",(ulong)(uint)gridy);
  Fl_Input_::value((Fl_Input_ *)vertical_input,local_98);
  sprintf(local_98,"%d",(ulong)(uint)snap);
  Fl_Input_::value((Fl_Input_ *)snap_input,local_98);
  Fl_Button::value((Fl_Button *)guides_toggle,show_guides);
  if (Fl_Widget_Type::default_size < 9) {
    Fl_Button::setonly((Fl_Button *)def_widget_size[0]);
  }
  else if (Fl_Widget_Type::default_size < 0xc) {
    Fl_Button::setonly((Fl_Button *)def_widget_size[1]);
  }
  else if (Fl_Widget_Type::default_size < 0xf) {
    Fl_Button::setonly((Fl_Button *)def_widget_size[2]);
  }
  else if (Fl_Widget_Type::default_size < 0x13) {
    Fl_Button::setonly((Fl_Button *)def_widget_size[3]);
  }
  else if (Fl_Widget_Type::default_size < 0x19) {
    Fl_Button::setonly((Fl_Button *)def_widget_size[4]);
  }
  else if (Fl_Widget_Type::default_size < 0x21) {
    Fl_Button::setonly((Fl_Button *)def_widget_size[5]);
  }
  Fl_Window::hotspot(&grid_window->super_Fl_Window,(Fl_Widget *)grid_window,0);
  (*(grid_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  return;
}

Assistant:

void show_grid_cb(Fl_Widget *, void *) {
  char buf[128];
  sprintf(buf,"%d",gridx); horizontal_input->value(buf);
  sprintf(buf,"%d",gridy); vertical_input->value(buf);
  sprintf(buf,"%d",snap); snap_input->value(buf);
  guides_toggle->value(show_guides);
  int s = Fl_Widget_Type::default_size;
  if (s<=8) def_widget_size[0]->setonly();
  else if (s<=11) def_widget_size[1]->setonly();
  else if (s<=14) def_widget_size[2]->setonly();
  else if (s<=18) def_widget_size[3]->setonly();
  else if (s<=24) def_widget_size[4]->setonly();
  else if (s<=32) def_widget_size[5]->setonly();
  grid_window->hotspot(grid_window);
  grid_window->show();
}